

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameColumnElistNames(Parse *pParse,RenameCtx *pCtx,ExprList *pEList,char *zOld)

{
  byte bVar1;
  char *pPtr;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((pEList == (ExprList *)0x0) || (iVar2 = pEList->nExpr, iVar2 < 1)) {
    return;
  }
  lVar4 = 0;
LAB_001ba22d:
  if (((zOld != (char *)0x0) && ((*(ushort *)&pEList->a[lVar4].fg.field_0x1 & 3) == 0)) &&
     (pPtr = pEList->a[lVar4].zEName, pPtr != (char *)0x0)) {
    lVar3 = 0;
    do {
      bVar1 = pPtr[lVar3];
      if (bVar1 == zOld[lVar3]) {
        if ((ulong)bVar1 == 0) goto LAB_001ba277;
      }
      else if (""[bVar1] != ""[(byte)zOld[lVar3]]) break;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  goto LAB_001ba286;
LAB_001ba277:
  renameTokenFind(pParse,pCtx,pPtr);
  iVar2 = pEList->nExpr;
LAB_001ba286:
  lVar4 = lVar4 + 1;
  if (iVar2 <= lVar4) {
    return;
  }
  goto LAB_001ba22d;
}

Assistant:

static void renameColumnElistNames(
  Parse *pParse,
  RenameCtx *pCtx,
  const ExprList *pEList,
  const char *zOld
){
  if( pEList ){
    int i;
    for(i=0; i<pEList->nExpr; i++){
      const char *zName = pEList->a[i].zEName;
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME)
       && ALWAYS(zName!=0)
       && 0==sqlite3_stricmp(zName, zOld)
      ){
        renameTokenFind(pParse, pCtx, (const void*)zName);
      }
    }
  }
}